

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

void __thiscall duckdb_tdigest::TDigest::updateCumulative(TDigest *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double previous;
  double local_40;
  double local_38;
  double local_30;
  
  pdVar1 = (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->processed_).
                super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->processed_).
                super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  this_00 = &this->cumulative_;
  if ((this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  std::vector<double,_std::allocator<double>_>::reserve(this_00,lVar2 + 1);
  previous = 0.0;
  lVar3 = 8;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    local_40 = *(double *)
                ((long)&((this->processed_).
                         super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                         ._M_impl.super__Vector_impl_data._M_start)->mean_ + lVar3);
    local_30 = local_40 * 0.5 + previous;
    local_38 = previous;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_30);
    previous = local_38 + local_40;
    lVar3 = lVar3 + 0x10;
  }
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&previous);
  return;
}

Assistant:

void updateCumulative() {
		const auto n = processed_.size();
		cumulative_.clear();
		cumulative_.reserve(n + 1);
		auto previous = 0.0;
		for (Index i = 0; i < n; i++) {
			auto current = weight(i);
			auto halfCurrent = current / 2.0;
			cumulative_.push_back(previous + halfCurrent);
			previous = previous + current;
		}
		cumulative_.push_back(previous);
	}